

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::NormalGetFullPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact,bool realname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined7 in_register_00000081;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string local_c8;
  undefined4 local_94;
  string local_90;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_94 = (undefined4)CONCAT71(in_register_00000081,realname);
  GetDirectory(&local_90,this,config,artifact);
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = &DAT_00000001;
  local_c8.field_2._M_local_buf[0] = '/';
  local_50._M_len = local_90._M_string_length;
  local_50._M_str = local_90._M_dataplus._M_p;
  local_40 = 1;
  views._M_len = 2;
  views._M_array = &local_50;
  local_c8._M_string_length = (size_type)paVar1;
  local_38 = paVar1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  bVar2 = IsAppBundleOnApple(this);
  if (bVar2) {
    BuildBundleDirectory(&local_70,this,__return_storage_ptr__,config,FullLevel);
    local_c8._M_dataplus._M_p = &DAT_00000001;
    local_c8.field_2._M_local_buf[0] = '/';
    local_50._M_len = local_70._M_string_length;
    local_50._M_str = local_70._M_dataplus._M_p;
    local_40 = 1;
    views_00._M_len = 2;
    views_00._M_array = &local_50;
    local_c8._M_string_length = (size_type)paVar1;
    local_38 = paVar1;
    cmCatViews_abi_cxx11_(&local_90,views_00);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if (artifact == ImportLibraryArtifact) {
    GetFullName(&local_c8,this,config,ImportLibraryArtifact);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p)
    ;
  }
  else {
    if (artifact != RuntimeBinaryArtifact) {
      return __return_storage_ptr__;
    }
    if ((char)local_94 == '\0') {
      GetFullName(&local_c8,this,config,RuntimeBinaryArtifact);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p);
    }
    else {
      NormalGetRealName(&local_c8,this,config);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_c8._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  bool realname) const
{
  std::string fpath = cmStrCat(this->GetDirectory(config, artifact), '/');
  if (this->IsAppBundleOnApple()) {
    fpath =
      cmStrCat(this->BuildBundleDirectory(fpath, config, FullLevel), '/');
  }

  // Add the full name of the target.
  switch (artifact) {
    case cmStateEnums::RuntimeBinaryArtifact:
      if (realname) {
        fpath += this->NormalGetRealName(config);
      } else {
        fpath +=
          this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact);
      }
      break;
    case cmStateEnums::ImportLibraryArtifact:
      fpath += this->GetFullName(config, cmStateEnums::ImportLibraryArtifact);
      break;
  }
  return fpath;
}